

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

double __thiscall ON_OBSOLETE_V5_DimOrdinate::KinkOffset(ON_OBSOLETE_V5_DimOrdinate *this,int index)

{
  int index_local;
  ON_OBSOLETE_V5_DimOrdinate *this_local;
  
  if (index == 0) {
    this_local = (ON_OBSOLETE_V5_DimOrdinate *)this->m_kink_offset_0;
  }
  else if (index == 1) {
    this_local = (ON_OBSOLETE_V5_DimOrdinate *)this->m_kink_offset_1;
  }
  else {
    this_local = (ON_OBSOLETE_V5_DimOrdinate *)0xffe5f8bd9e331dd2;
  }
  return (double)this_local;
}

Assistant:

double ON_OBSOLETE_V5_DimOrdinate::KinkOffset( int index) const
{
  if( index == 0)
    return m_kink_offset_0;
  else if( index == 1)
    return m_kink_offset_1;
  else
    return ON_UNSET_VALUE;
}